

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O3

int __thiscall YAML::RegEx::Match<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  Stream *pSVar1;
  _Map_pointer ppcVar2;
  _Elt_pointer pcVar3;
  bool bVar4;
  int iVar5;
  char cVar6;
  _Elt_pointer pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  pSVar1 = source->m_stream;
  ppcVar2 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
       super__Deque_impl_data._M_start._M_last +
       (long)((pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur +
             ((((((ulong)((long)ppcVar2 -
                         (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x200 -
              (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) -
             (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur)) <= (_Elt_pointer)source->m_offset) &&
     (bVar4 = YAML::Stream::_ReadAheadTo(pSVar1,source->m_offset), !bVar4)) {
    return -1;
  }
  iVar5 = -1;
  switch(this->m_op) {
  case REGEX_EMPTY:
    break;
  case REGEX_MATCH:
    pSVar1 = source->m_stream;
    pcVar3 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar3 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)pcVar7 < 0) {
      uVar9 = (long)pcVar7 >> 9;
    }
    else {
      if (pcVar7 < (_Elt_pointer)0x200) {
        pcVar8 = pcVar3 + source->m_offset;
        goto LAB_00713a63;
      }
      uVar9 = (ulong)pcVar7 >> 9;
    }
    pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_node[uVar9] + (long)(pcVar7 + uVar9 * -0x200);
LAB_00713a63:
    return (uint)(*pcVar8 == this->m_a) * 2 + -1;
  case REGEX_RANGE:
    pSVar1 = source->m_stream;
    pcVar3 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar7 = pcVar3 + (source->m_offset -
                      (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)pcVar7 < 0) {
      uVar9 = (long)pcVar7 >> 9;
    }
    else {
      if (pcVar7 < (_Elt_pointer)0x200) {
        cVar6 = pcVar3[source->m_offset];
        if (cVar6 < this->m_a) {
          return -1;
        }
        goto LAB_00713a1c;
      }
      uVar9 = (ulong)pcVar7 >> 9;
    }
    pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_node[uVar9];
    if (pcVar8[(uint)pcVar7 & 0x1ff] < this->m_a) {
      return -1;
    }
    cVar6 = pcVar8[(long)(pcVar7 + uVar9 * -0x200)];
LAB_00713a1c:
    return (uint)(cVar6 <= this->m_z) * 2 + -1;
  case REGEX_OR:
    iVar5 = MatchOpOr<YAML::StreamCharSource>(this,source);
    return iVar5;
  case REGEX_AND:
    iVar5 = MatchOpAnd<YAML::StreamCharSource>(this,source);
    return iVar5;
  case REGEX_NOT:
    iVar5 = MatchOpNot<YAML::StreamCharSource>(this,source);
    return iVar5;
  case REGEX_SEQ:
    iVar5 = MatchOpSeq<YAML::StreamCharSource>(this,source);
    return iVar5;
  default:
    goto switchD_007138e9_default;
  }
  pSVar1 = source->m_stream;
  pcVar3 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pcVar7 = pcVar3 + (source->m_offset -
                    (long)(pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first);
  if ((long)pcVar7 < 0) {
    uVar9 = (long)pcVar7 >> 9;
LAB_00713a34:
    pcVar8 = (pSVar1->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_node[uVar9] + (long)(pcVar7 + uVar9 * -0x200);
  }
  else {
    if ((_Elt_pointer)0x1ff < pcVar7) {
      uVar9 = (ulong)pcVar7 >> 9;
      goto LAB_00713a34;
    }
    pcVar8 = pcVar3 + source->m_offset;
  }
  iVar5 = -(uint)(*pcVar8 != '\x04');
switchD_007138e9_default:
  return iVar5;
}

Assistant:

inline int RegEx::Match(const Source& source) const {
  return IsValidSource(source) ? MatchUnchecked(source) : -1;
}